

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRSearchPath.cpp
# Opt level: O0

void __thiscall MinVR::VRSearchPlugin::VRSearchPlugin(VRSearchPlugin *this)

{
  undefined8 *in_RDI;
  allocator<char> *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff47;
  string *in_stack_ffffffffffffff48;
  VRSearchPath *in_stack_ffffffffffffff50;
  allocator<char> local_89;
  string local_88 [39];
  allocator<char> local_61;
  string local_60 [55];
  allocator<char> local_29;
  string local_28 [40];
  
  VRSearchPath::VRSearchPath((VRSearchPath *)0x135e11);
  *in_RDI = &PTR__selectFile_001bc7b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  VRSearchPath::addPathEntry
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(bool)in_stack_ffffffffffffff47);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  VRSearchPath::addPathEntry
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(bool)in_stack_ffffffffffffff47);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  VRSearchPath::addPathEntry
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(bool)in_stack_ffffffffffffff47);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  VRSearchPath::addPathEntry
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(bool)in_stack_ffffffffffffff47);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff4f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  VRSearchPath::addPathEntry
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(bool)in_stack_ffffffffffffff47);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff27);
  return;
}

Assistant:

VRSearchPlugin::VRSearchPlugin() {

  // 1. already added externally

  // 2. current working directory
  addPathEntry("./", false);

  // 3. installation pointed to by the $MINVR_ROOT$ envvar
  addPathEntry("${MINVR_ROOT}/lib/MinVR" MINVR_VERSION_STR "/", false);
  addPathEntry("${MINVR_ROOT}/bin/MinVR" MINVR_VERSION_STR "/", false);

  // 4. installation prefix #defined in VRConfig.h (set by cmake)
  addPathEntry(MINVR_INSTALL_PLUGIN_DIR "/", false);

  // 5. build directory #defined in VRConfig.h (set by cmake)
  addPathEntry(MINVR_BUILD_PLUGIN_DIR "/", false);
}